

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O3

sexp_conflict
sexp_bit_ior(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict x,sexp_conflict y)

{
  sexp_uint_t *psVar1;
  ulong *puVar2;
  long lVar3;
  sexp_conflict psVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict local_58;
  sexp_conflict local_50;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_58 = (sexp_conflict)0x43e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  local_50 = (sexp_conflict)0x43e;
  local_38.var = (sexp_conflict *)0x0;
  local_38.next = (sexp_gc_var_t *)0x0;
  if (((ulong)x & 1) == 0) {
    psVar4 = x;
    if ((((ulong)x & 2) == 0) && (x->tag == 0xc)) {
      local_38.next = &local_48;
      local_48.next = (ctx->value).context.saves;
      local_38.var = &local_50;
      (ctx->value).context.saves = &local_38;
      if (((ulong)y & 1) == 0) {
        if ((((ulong)y & 2) == 0) && (y->tag == 0xc)) {
          if ((x->value).type.cpl < (y->value).type.cpl) {
            local_48.var = &local_58;
            local_58 = (sexp_conflict)sexp_copy_bignum(ctx,0,y,0);
            lVar7 = (local_58->value).fileno.fd;
          }
          else {
            local_48.var = &local_58;
            local_58 = (sexp_conflict)sexp_copy_bignum(ctx,0,x,0);
            lVar7 = (local_58->value).fileno.fd;
            x = y;
          }
          local_50 = sexp_twos_complement(ctx,x);
LAB_001017dd:
          if ((local_58->value).flonum_bits[0] < '\0') {
            sexp_set_twos_complement(local_58);
          }
          if (0 < lVar7) {
            lVar3 = (local_50->value).fileno.fd;
            lVar5 = 0;
            do {
              if (lVar5 < lVar3) {
                uVar6 = *(ulong *)((long)&local_50->value + lVar5 * 8 + 0x10);
              }
              else {
                uVar6 = (ulong)((local_50->value).flonum_bits[0] >> 7);
              }
              puVar2 = (ulong *)((long)&local_58->value + lVar5 * 8 + 0x10);
              *puVar2 = *puVar2 | uVar6;
              lVar5 = lVar5 + 1;
            } while (lVar7 != lVar5);
          }
          if ((((local_58->value).flonum_bits[0] < '\0') ||
              ((local_50->value).flonum_bits[0] < '\0')) &&
             (*(long *)((long)&local_58->value + lVar7 * 8 + 8) < 0)) {
            sexp_set_twos_complement(local_58);
            if ('\0' < (local_58->value).flonum_bits[0]) {
              if ((((ulong)local_58 & 3) == 0) && (local_58->tag == 0xc)) {
                (local_58->value).flonum_bits[0] = -(local_58->value).flonum_bits[0];
              }
              else if (((ulong)local_58 & 1) != 0) {
                local_58 = (sexp_conflict)(1 - ((ulong)local_58 & 0xfffffffffffffffe));
              }
            }
          }
        }
        else {
          local_48.var = &local_58;
          local_58 = (sexp_conflict)sexp_type_exception(ctx,self,2,y);
        }
      }
      else {
        uVar6 = (long)y >> 1;
        local_48.var = &local_58;
        local_58 = (sexp_conflict)sexp_copy_bignum(ctx,0,x,0);
        if ((long)uVar6 < 0) {
          lVar7 = (local_58->value).fileno.fd;
          local_50 = sexp_fixnum_to_twos_complement(ctx,y,(int)lVar7);
          goto LAB_001017dd;
        }
        if ((local_58->value).flonum_bits[0] < '\0') {
          sexp_set_twos_complement(local_58);
          psVar1 = &(local_58->value).string.length;
          *psVar1 = *psVar1 | uVar6;
          if ((local_58->value).flonum_bits[0] < '\0') {
            sexp_set_twos_complement(local_58);
          }
        }
        else {
          psVar1 = &(local_58->value).string.length;
          *psVar1 = *psVar1 | uVar6;
        }
      }
      (ctx->value).context.saves = local_48.next;
      goto LAB_00101725;
    }
  }
  else {
    if (((ulong)y & 1) != 0) {
      local_58 = (sexp_conflict)((ulong)y | (ulong)x);
      goto LAB_00101725;
    }
    psVar4 = y;
    if ((((ulong)y & 2) == 0) && (y->tag == 0xc)) {
      local_58 = sexp_bit_ior(ctx,self,n,y,x);
      goto LAB_00101725;
    }
  }
  local_58 = (sexp_conflict)sexp_type_exception(ctx,self,2,psVar4);
LAB_00101725:
  psVar4 = (sexp_conflict)sexp_bignum_normalize(local_58);
  return psVar4;
}

Assistant:

sexp sexp_bit_ior (sexp ctx, sexp self, sexp_sint_t n, sexp x, sexp y) {
#if SEXP_USE_BIGNUMS
  sexp_sint_t len, tmplen, i;
#endif
  sexp_gc_var2(res, tmp);
  if (sexp_fixnump(x)) {
    if (sexp_fixnump(y))
      res = (sexp) ((sexp_uint_t)x | (sexp_uint_t)y);
#if SEXP_USE_BIGNUMS
    else if (sexp_bignump(y))
      res = sexp_bit_ior(ctx, self, n, y, x);
#endif
    else
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y);
#if SEXP_USE_BIGNUMS
  } else if (sexp_bignump(x)) {
    sexp_gc_preserve2(ctx, res, tmp);
    if (sexp_fixnump(y) && sexp_unbox_fixnum(y) >= 0) {
      res = sexp_copy_bignum(ctx, NULL, x, 0);
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
      sexp_bignum_data(res)[0] |= (sexp_uint_t)sexp_unbox_fixnum(y);
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
    } else if (sexp_bignump(y) || sexp_fixnump(y)) {
      if (sexp_fixnump(y) || sexp_bignum_length(x) >= sexp_bignum_length(y)) {
        res = sexp_copy_bignum(ctx, NULL, x, 0);
        len = sexp_bignum_length(res);
        tmp = sexp_fixnump(y) ? sexp_fixnum_to_twos_complement(ctx, y, len) : sexp_twos_complement(ctx, y);
      } else {
        res = sexp_copy_bignum(ctx, NULL, y, 0);
        len = sexp_bignum_length(res);
        tmp = sexp_twos_complement(ctx, x);
      }
      if (sexp_bignum_sign(res) < 0)
        sexp_set_twos_complement(res);
      tmplen = sexp_bignum_length(tmp);
      for (i=0; i<len; i++)
        sexp_bignum_data(res)[i] |= (i<tmplen ? sexp_bignum_data(tmp)[i] : sexp_bignum_sign(tmp) < 0 ? -1 : 0);
      if ((sexp_bignum_sign(res) < 0 || sexp_bignum_sign(tmp) < 0) && ((sexp_sint_t)(sexp_bignum_data(res)[len-1])) < 0) {
        sexp_set_twos_complement(res);
        if (sexp_bignum_sign(res) > 0) {
          sexp_negate_exact(res);
        }
      }
    } else {
      res = sexp_type_exception(ctx, self, SEXP_FIXNUM, y);
    }
    sexp_gc_release2(ctx);
#endif
  } else {
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, x);
  }
  return sexp_bignum_normalize(res);
}